

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

index_stream *
index_stream_init(lzma_vli compressed_base,lzma_vli uncompressed_base,lzma_vli stream_number,
                 lzma_vli block_number_base,lzma_allocator *allocator)

{
  index_stream *s;
  lzma_allocator *allocator_local;
  lzma_vli block_number_base_local;
  lzma_vli stream_number_local;
  lzma_vli uncompressed_base_local;
  lzma_vli compressed_base_local;
  
  compressed_base_local = (lzma_vli)lzma_alloc(0xa8,allocator);
  if ((lzma_vli *)compressed_base_local == (lzma_vli *)0x0) {
    compressed_base_local = 0;
  }
  else {
    *(lzma_vli *)compressed_base_local = uncompressed_base;
    *(lzma_vli *)(compressed_base_local + 8) = compressed_base;
    *(lzma_vli *)(compressed_base_local + 0x10) = 0;
    *(lzma_vli *)(compressed_base_local + 0x18) = 0;
    *(lzma_vli *)(compressed_base_local + 0x20) = 0;
    *(int *)(compressed_base_local + 0x28) = (int)stream_number;
    *(lzma_vli *)(compressed_base_local + 0x30) = block_number_base;
    index_tree_init((index_tree *)(compressed_base_local + 0x38));
    *(lzma_vli *)(compressed_base_local + 0x58) = 0;
    *(lzma_vli *)(compressed_base_local + 0x60) = 0;
    *(undefined4 *)(compressed_base_local + 0x68) = 0xffffffff;
    *(lzma_vli *)(compressed_base_local + 0xa0) = 0;
  }
  return (index_stream *)compressed_base_local;
}

Assistant:

static index_stream *
index_stream_init(lzma_vli compressed_base, lzma_vli uncompressed_base,
		lzma_vli stream_number, lzma_vli block_number_base,
		lzma_allocator *allocator)
{
	index_stream *s = lzma_alloc(sizeof(index_stream), allocator);
	if (s == NULL)
		return NULL;

	s->node.uncompressed_base = uncompressed_base;
	s->node.compressed_base = compressed_base;
	s->node.parent = NULL;
	s->node.left = NULL;
	s->node.right = NULL;

	s->number = stream_number;
	s->block_number_base = block_number_base;

	index_tree_init(&s->groups);

	s->record_count = 0;
	s->index_list_size = 0;
	s->stream_flags.version = UINT32_MAX;
	s->stream_padding = 0;

	return s;
}